

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

gen_digits_params fmt::v5::internal::process_specs(core_format_specs *specs,int exp,buffer *buf)

{
  char cVar1;
  gen_digits_params gVar2;
  long value;
  basic_buffer<char> *in_RDX;
  int in_ESI;
  char_counter *in_RDI;
  gen_digits_params *unaff_retaddr;
  char_counter counter;
  int adjusted_min_digits;
  int num_digits;
  gen_digits_params params;
  size_t in_stack_ffffffffffffffb8;
  int local_34;
  int local_24;
  undefined1 in_stack_fffffffffffffffc;
  undefined1 in_stack_fffffffffffffffd;
  undefined1 in_stack_fffffffffffffffe;
  undefined1 in_stack_ffffffffffffffff;
  
  memset(&stack0xfffffffffffffff8,0,8);
  if ((int)in_RDI->size < 0) {
    local_34 = 6;
  }
  else {
    local_34 = (int)in_RDI->size;
  }
  local_24 = local_34;
  cVar1 = *(char *)((long)&in_RDI->size + 5);
  if (cVar1 != '\0') {
    if (cVar1 == 'E') {
      in_stack_fffffffffffffffd = 1;
LAB_00167636:
      local_24 = local_34 + 1;
      goto LAB_00167641;
    }
    if (cVar1 == 'F') {
      in_stack_fffffffffffffffd = 1;
LAB_0016760a:
      in_stack_fffffffffffffffc = 1;
      in_stack_fffffffffffffffe = 1;
      if (0 < local_34 + in_ESI) {
        local_24 = local_34 + in_ESI;
      }
      goto LAB_00167641;
    }
    if (cVar1 == 'G') {
      in_stack_fffffffffffffffd = 1;
    }
    else {
      if (cVar1 == 'e') goto LAB_00167636;
      if (cVar1 == 'f') goto LAB_0016760a;
      if (cVar1 != 'g') goto LAB_00167641;
    }
  }
  in_stack_fffffffffffffffe = (in_RDI->size & 0x800000000) != 0;
  if ((((-5 < in_ESI) && (in_ESI < local_34 + 1)) &&
      (in_stack_fffffffffffffffc = 1, *(char *)((long)&in_RDI->size + 5) == '\0')) &&
     (((bool)in_stack_fffffffffffffffe && (-1 < in_ESI)))) {
    local_24 = in_ESI + 1;
  }
LAB_00167641:
  value = (long)local_24;
  grisu2_prettify<fmt::v5::internal::char_counter&>
            (unaff_retaddr,
             CONCAT13(in_stack_ffffffffffffffff,
                      CONCAT12(in_stack_fffffffffffffffe,
                               CONCAT11(in_stack_fffffffffffffffd,in_stack_fffffffffffffffc))),
             local_24,in_RDI);
  to_unsigned<long>(value);
  basic_buffer<char>::resize(in_RDX,in_stack_ffffffffffffffb8);
  gVar2.fixed = (bool)in_stack_fffffffffffffffc;
  gVar2.num_digits = local_24;
  gVar2.upper = (bool)in_stack_fffffffffffffffd;
  gVar2.trailing_zeros = (bool)in_stack_fffffffffffffffe;
  gVar2._7_1_ = in_stack_ffffffffffffffff;
  return gVar2;
}

Assistant:

FMT_FUNC gen_digits_params process_specs(const core_format_specs &specs,
                                         int exp, buffer &buf) {
  auto params = gen_digits_params();
  int num_digits = specs.precision >= 0 ? specs.precision : 6;
  switch (specs.type) {
  case 'G':
    params.upper = true;
    FMT_FALLTHROUGH
  case '\0': case 'g':
    params.trailing_zeros = (specs.flags & HASH_FLAG) != 0;
    if (-4 <= exp && exp < num_digits + 1) {
      params.fixed = true;
      if (!specs.type && params.trailing_zeros && exp >= 0)
        num_digits = exp + 1;
    }
    break;
  case 'F':
    params.upper = true;
    FMT_FALLTHROUGH
  case 'f': {
    params.fixed = true;
    params.trailing_zeros = true;
    int adjusted_min_digits = num_digits + exp;
    if (adjusted_min_digits > 0)
      num_digits = adjusted_min_digits;
    break;
  }
  case 'E':
    params.upper = true;
    FMT_FALLTHROUGH
  case 'e':
    ++num_digits;
    break;
  }
  params.num_digits = num_digits;
  char_counter counter{num_digits};
  grisu2_prettify(params, params.num_digits, exp - num_digits, counter);
  buf.resize(to_unsigned(counter.size));
  return params;
}